

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O1

uint __thiscall bhf::Commandline::Pop<unsigned_int>(Commandline *this,string *errorMessage)

{
  char **ppcVar1;
  uint uVar2;
  undefined8 uVar3;
  allocator local_29;
  string local_28;
  
  if (this->argc == 0) {
    uVar2 = 0;
    if (errorMessage->_M_string_length != 0) {
      if ((this->usage).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar3 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_28._M_dataplus._M_p != &local_28.field_2) {
          operator_delete(local_28._M_dataplus._M_p);
        }
        _Unwind_Resume(uVar3);
      }
      (*(this->usage)._M_invoker)((_Any_data *)this,errorMessage);
    }
  }
  else {
    this->argc = this->argc + -1;
    ppcVar1 = this->argv;
    this->argv = ppcVar1 + 1;
    std::__cxx11::string::string((string *)&local_28,*ppcVar1,&local_29);
    uVar2 = StringTo<unsigned_int>(&local_28,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
  }
  return uVar2;
}

Assistant:

T Pop(const std::string& errorMessage = {})
    {
        if (argc) {
            --argc;
            return StringTo<T>(*(argv++));
        }
        if (!errorMessage.empty()) {
            usage(errorMessage);
        }
        return T {};
    }